

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O3

REF_STATUS
ref_inflate_read_usm3d_mapbc
          (REF_DICT faceids,char *mapbc_file_name,char *family_name,REF_INT boundary_condition)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  REF_STATUS RVar4;
  REF_INT bc;
  REF_INT faceid;
  REF_DICT local_860;
  size_t local_858;
  char *local_850;
  REF_INT i1;
  REF_INT i0;
  REF_INT bc_family;
  char line [1024];
  char family [1024];
  
  local_860 = faceids;
  local_850 = family_name;
  local_858 = strlen(family_name);
  __stream = fopen(mapbc_file_name,"r");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",mapbc_file_name);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x462
           ,"ref_inflate_read_usm3d_mapbc","unable to open file");
    RVar4 = 2;
  }
  else {
    pcVar3 = fgets(line,0x400,__stream);
    if (pcVar3 != (char *)0x0) {
      do {
        iVar1 = __isoc99_sscanf(line,"%d %d %d %d %d %s",&faceid,&bc,&bc_family,&i0,&i1,family);
        if ((((iVar1 == 6) && (iVar1 = strncmp(local_850,family,local_858), iVar1 == 0)) &&
            (bc == boundary_condition)) && (uVar2 = ref_dict_store(local_860,faceid,-1), uVar2 != 0)
           ) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                 ,0x468,"ref_inflate_read_usm3d_mapbc",(ulong)uVar2,"store");
          return uVar2;
        }
        pcVar3 = fgets(line,0x400,__stream);
      } while (pcVar3 != (char *)0x0);
    }
    fclose(__stream);
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_read_usm3d_mapbc(REF_DICT faceids,
                                                const char *mapbc_file_name,
                                                const char *family_name,
                                                REF_INT boundary_condition) {
  FILE *file;
  char line[1024];
  char family[1024];
  REF_INT faceid, bc, bc_family, i0, i1;
  size_t len;

  len = strlen(family_name);

  file = fopen(mapbc_file_name, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", mapbc_file_name);
  RNS(file, "unable to open file");

  while (fgets(line, sizeof(line), file) != NULL) {
    if (6 == sscanf(line, "%d %d %d %d %d %s", &faceid, &bc, &bc_family, &i0,
                    &i1, family)) {
      if (0 == strncmp(family_name, family, len) && bc == boundary_condition) {
        RSS(ref_dict_store(faceids, faceid, REF_EMPTY), "store");
      }
    }
  }

  fclose(file);
  return REF_SUCCESS;
}